

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

ThreadPoolImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::ThreadPoolImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::ThreadPoolImpl,Diligent::IMemoryAllocator> *this,
          ThreadPoolCreateInfo *CtorArgs)

{
  ThreadPoolCreateInfo *pTVar1;
  ThreadPoolImpl *local_30;
  ThreadPoolImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  ThreadPoolCreateInfo *CtorArgs_local;
  MakeNewRCObj<Diligent::ThreadPoolImpl,_Diligent::IMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pTVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (ThreadPoolImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (ThreadPoolImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_30 = (ThreadPoolImpl *)
               RefCountedObject<Diligent::IThreadPool>::operator_new
                         ((RefCountedObject<Diligent::IThreadPool> *)0x100,(size_t)pTVar1);
    ThreadPoolImpl::ThreadPoolImpl(local_30,(IReferenceCounters *)pObj,CtorArgs);
  }
  else {
    local_30 = (ThreadPoolImpl *)
               new<Diligent::IMemoryAllocator>
                         (0x100,*(IMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    ThreadPoolImpl::ThreadPoolImpl(local_30,(IReferenceCounters *)pObj,CtorArgs);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::ThreadPoolImpl,Diligent::IMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_30,*(IMemoryAllocator **)this);
  }
  return local_30;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }